

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O3

gnode_t * parse_macro_statement(gravity_parser_t *parser)

{
  gravity_lexer_t *pgVar1;
  gravity_delegate_t *pgVar2;
  gtoken_s token_00;
  gtoken_t gVar3;
  uint32_t uVar4;
  int iVar5;
  gnode_t *extraout_RAX;
  char *pcVar6;
  gnode_t *extraout_RAX_00;
  gravity_lexer_t *pgVar7;
  gravity_lexer_t **ppgVar8;
  gnode_t *extraout_RAX_01;
  gravity_class_t *ast;
  gnode_t *ast_00;
  gnode_t *ast_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  gravity_class_t **ppgVar9;
  gnode_t *pgVar10;
  gnode_t *extraout_RAX_02;
  gnode_t *extraout_RAX_03;
  gnode_t *extraout_RAX_04;
  gnode_t *extraout_RAX_05;
  gnode_t *extraout_RAX_06;
  gnode_t *extraout_RAX_07;
  gnode_t *extraout_RAX_08;
  undefined4 extraout_var_01;
  lexer_r *plVar11;
  char *pcVar12;
  size_t sVar13;
  error_type_t error_type;
  size_t sVar14;
  ulong uVar15;
  uint32_t uVar16;
  gravity_value_t v;
  uint32_t fileid;
  size_t size;
  gtoken_s token;
  char buffer [1024];
  _Bool local_8d1;
  gravity_class_t *local_8d0;
  gnode_t *local_8c8;
  uint32_t local_8bc;
  gnode_t *local_8b8;
  gnode_t *local_8b0;
  uint32_t *local_8a8;
  char *local_8a0;
  size_t local_898;
  ulong local_890;
  undefined4 local_888 [20];
  undefined8 local_838 [4];
  char *local_818;
  uint32_t local_438;
  undefined4 uStack_434;
  undefined4 uStack_430;
  undefined4 uStack_42c;
  undefined4 local_428;
  undefined4 uStack_424;
  undefined4 uStack_420;
  undefined4 uStack_41c;
  char *local_418;
  
  pgVar1 = parser->lexer->p[parser->lexer->n - 1];
  gVar3 = gravity_lexer_next(pgVar1);
  if (gVar3 != TOK_MACRO) {
    __assert_fail("type == TOK_MACRO",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                  ,0x96f,"gnode_t *parse_macro_statement(gravity_parser_t *)");
  }
  gVar3 = gravity_lexer_peek(pgVar1);
  if ((gVar3 == TOK_OP_NOT) && (uVar4 = gravity_lexer_lineno(pgVar1), uVar4 == 1)) {
    gVar3 = gravity_lexer_next(pgVar1);
    if (gVar3 == TOK_OP_NOT) {
      gravity_lexer_skip_line(pgVar1);
      return extraout_RAX;
    }
    __assert_fail("type == TOK_OP_NOT",
                  "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_parser.c"
                  ,0x976,"gnode_t *parse_macro_statement(gravity_parser_t *)");
  }
  pcVar6 = parse_identifier(parser);
  if (pcVar6 == (char *)0x0) {
LAB_0011ba51:
    gravity_lexer_token(pgVar1);
    pcVar12 = "%s";
    pcVar6 = "Unknown macro token. Declaration will be ignored.";
    error_type = GRAVITY_WARNING;
LAB_0011ba95:
    report_error(parser,error_type,pcVar12,pcVar6);
    return extraout_RAX_00;
  }
  iVar5 = string_cmp(pcVar6,"unittest");
  if (iVar5 == 0) {
    iVar5 = 1;
  }
  else {
    iVar5 = string_cmp(pcVar6,"include");
    if (iVar5 == 0) {
      iVar5 = 2;
    }
    else {
      iVar5 = string_cmp(pcVar6,"push");
      if (iVar5 == 0) {
        iVar5 = 3;
      }
      else {
        iVar5 = string_cmp(pcVar6,"pop");
        iVar5 = (uint)(iVar5 == 0) << 2;
      }
    }
  }
  free(pcVar6);
  gravity_lexer_token(pgVar1);
  local_888[0] = 7;
  pgVar2 = parser->delegate;
  if ((pgVar2 != (gravity_delegate_t *)0x0) &&
     (pgVar2->parser_callback != (gravity_parser_callback)0x0)) {
    (*pgVar2->parser_callback)(local_888,pgVar2->xdata);
  }
  if (iVar5 == 2) {
    pgVar1 = parser->lexer->p[parser->lexer->n - 1];
    gVar3 = gravity_lexer_next(pgVar1);
    gravity_lexer_token(pgVar1);
    local_818 = local_418;
    local_838[0] = CONCAT44(uStack_434,local_438);
    if (gVar3 == TOK_STRING) {
      do {
        if ((parser->delegate == (gravity_delegate_t *)0x0) ||
           (parser->delegate->loadfile_callback == (gravity_loadfile_callback)0x0)) {
          gravity_lexer_token(pgVar1);
          pcVar6 = "Unable to load file because no loadfile callback registered in delegate.";
          goto LAB_0011bd8f;
        }
        local_438 = 0;
        token_00.colno = uStack_430;
        token_00.type = (undefined4)local_838[0];
        token_00.lineno = local_838[0]._4_4_;
        token_00.position = uStack_42c;
        token_00.bytes = local_428;
        token_00.length = uStack_424;
        token_00.fileid = uStack_420;
        token_00.builtin = uStack_41c;
        token_00.value = local_418;
        pcVar6 = token_string(token_00,&local_438);
        pcVar12 = (char *)gravity_calloc((gravity_vm *)0x0,1,(ulong)(local_438 + 1));
        memcpy(pcVar12,pcVar6,(ulong)local_438);
        local_898 = 0;
        local_8bc = 0;
        local_8d1 = false;
        pcVar6 = (*parser->delegate->loadfile_callback)
                           (pcVar12,&local_898,&local_8bc,parser->delegate->xdata,&local_8d1);
        if ((pcVar6 == (char *)0x0) ||
           (pgVar7 = gravity_lexer_create(pcVar6,local_898,local_8bc,local_8d1),
           pgVar7 == (gravity_lexer_t *)0x0)) {
          report_error(parser,GRAVITY_ERROR_SYNTAX,0x143bef,pcVar12);
        }
        else {
          plVar11 = parser->lexer;
          sVar13 = plVar11->n;
          if (sVar13 == plVar11->m) {
            sVar14 = sVar13 * 2;
            if (sVar13 == 0) {
              sVar14 = 8;
            }
            plVar11->m = sVar14;
            ppgVar8 = (gravity_lexer_t **)realloc(plVar11->p,sVar14 << 3);
            plVar11 = parser->lexer;
            plVar11->p = ppgVar8;
            sVar13 = plVar11->n;
          }
          else {
            ppgVar8 = plVar11->p;
          }
          plVar11->n = sVar13 + 1;
          ppgVar8[sVar13] = pgVar7;
        }
        if (pcVar12 != (char *)0x0) {
          free(pcVar12);
        }
        gVar3 = gravity_lexer_peek(pgVar1);
        if (gVar3 != TOK_OP_COMMA) {
          pgVar1 = parser->lexer->p[parser->lexer->n - 1];
          gVar3 = gravity_lexer_peek(pgVar1);
          if (gVar3 != TOK_OP_SEMICOLON) {
            return (gnode_t *)CONCAT44(extraout_var,gVar3);
          }
          gVar3 = gravity_lexer_next(pgVar1);
          return (gnode_t *)CONCAT44(extraout_var_00,gVar3);
        }
        gravity_lexer_next(pgVar1);
        gVar3 = gravity_lexer_next(pgVar1);
        gravity_lexer_token(pgVar1);
        local_818 = local_418;
        local_838[0] = CONCAT44(uStack_434,local_438);
      } while (gVar3 == TOK_STRING);
    }
    pcVar6 = token_name(gVar3);
    pcVar12 = "Expected file name but found %s.";
    error_type = GRAVITY_ERROR_SYNTAX;
    goto LAB_0011ba95;
  }
  if (iVar5 != 1) goto LAB_0011ba51;
  pgVar1 = parser->lexer->p[parser->lexer->n - 1];
  if (parser->statements->n != 2) {
    gravity_lexer_token(pgVar1);
    pcVar6 = 
    "#unittest macro cannot be embedded in a statement (it must be the root of the document).";
LAB_0011bd8f:
    report_error(parser,GRAVITY_ERROR_SYNTAX,pcVar6);
    return extraout_RAX_01;
  }
  parse_required(parser,TOK_OP_OPEN_CURLYBRACE);
  gVar3 = gravity_lexer_peek(pgVar1);
  if (gVar3 == TOK_OP_CLOSED_CURLYBRACE) {
    local_8c8 = (gnode_t *)0x0;
    local_8b8 = (gnode_t *)0x0;
    local_8b0 = (gnode_t *)0x0;
    ast_01 = (gnode_t *)0x0;
    ast_00 = (gnode_t *)0x0;
    ast = (gravity_class_t *)0x0;
  }
  else {
    ast = (gravity_class_t *)0x0;
    ast_00 = (gnode_t *)0x0;
    ast_01 = (gnode_t *)0x0;
    local_8b0 = (gnode_t *)0x0;
    local_8b8 = (gnode_t *)0x0;
    local_8c8 = (gnode_t *)0x0;
    do {
      pcVar6 = parse_identifier(parser);
      if (pcVar6 == (char *)0x0) goto LAB_0011c330;
      parse_required(parser,TOK_OP_COLON);
      iVar5 = string_cmp(pcVar6,"name");
      if (iVar5 == 0) {
        free(pcVar6);
        ast = (gravity_class_t *)parse_literal_expression(parser);
        pgVar10 = (gnode_t *)ast;
joined_r0x0011bf05:
        if (pgVar10 == (gnode_t *)0x0) {
LAB_0011c330:
          pgVar1 = parser->lexer->p[parser->lexer->n - 1];
          do {
            gVar3 = gravity_lexer_next(pgVar1);
            if (gVar3 == TOK_OP_CLOSED_CURLYBRACE) {
              return (gnode_t *)CONCAT44(extraout_var_01,gVar3);
            }
          } while (gVar3 != TOK_EOF);
          return (gnode_t *)CONCAT44(extraout_var_01,gVar3);
        }
      }
      else {
        iVar5 = string_cmp(pcVar6,"note");
        if (iVar5 == 0) {
          free(pcVar6);
          ast_00 = parse_literal_expression(parser);
          pgVar10 = ast_00;
          goto joined_r0x0011bf05;
        }
        iVar5 = string_cmp(pcVar6,"error");
        if (iVar5 == 0) {
          free(pcVar6);
          ast_01 = parse_identifier_expression(parser);
          pgVar10 = ast_01;
          goto joined_r0x0011bf05;
        }
        iVar5 = string_cmp(pcVar6,"error_row");
        if (iVar5 == 0) {
          free(pcVar6);
          local_8b0 = parse_literal_expression(parser);
          pgVar10 = local_8b0;
          goto joined_r0x0011bf05;
        }
        iVar5 = string_cmp(pcVar6,"error_col");
        if (iVar5 == 0) {
          free(pcVar6);
          local_8b8 = parse_literal_expression(parser);
          pgVar10 = local_8b8;
          goto joined_r0x0011bf05;
        }
        local_8d0 = ast;
        iVar5 = string_cmp(pcVar6,"result");
        free(pcVar6);
        if (iVar5 != 0) {
          gravity_lexer_token(pgVar1);
          report_error(parser,GRAVITY_ERROR_SYNTAX,0x143b12);
          goto LAB_0011c330;
        }
        gVar3 = gravity_lexer_peek(pgVar1);
        if ((gVar3 & ~TOK_ERROR) == TOK_OP_ADD) {
          gVar3 = gravity_lexer_next(pgVar1);
          local_8c8 = parse_literal_expression(parser);
          ast = local_8d0;
          pgVar10 = local_8c8;
          if ((local_8c8 == (gnode_t *)0x0) || (gVar3 != TOK_OP_SUB)) goto joined_r0x0011bf05;
          if (local_8c8[1].tag == NODE_COMPOUND_STAT) {
            *(ulong *)&local_8c8[1].block_length =
                 *(ulong *)&local_8c8[1].block_length ^ 0x8000000000000000;
          }
          else if (local_8c8[1].tag == NODE_LABEL_STAT) {
            *(long *)&local_8c8[1].block_length = -*(long *)&local_8c8[1].block_length;
          }
        }
        else {
          if (gVar3 != TOK_KEY_NULL) {
            local_8c8 = parse_literal_expression(parser);
            ast = local_8d0;
            pgVar10 = local_8c8;
            goto joined_r0x0011bf05;
          }
          gravity_lexer_next(pgVar1);
          local_8c8 = (gnode_t *)0x0;
          ast = local_8d0;
        }
      }
      pgVar7 = parser->lexer->p[parser->lexer->n - 1];
      gVar3 = gravity_lexer_peek(pgVar7);
      if (gVar3 == TOK_OP_SEMICOLON) {
        gravity_lexer_next(pgVar7);
      }
      gVar3 = gravity_lexer_peek(pgVar1);
    } while (gVar3 != TOK_OP_CLOSED_CURLYBRACE);
  }
  parse_required(parser,TOK_OP_CLOSED_CURLYBRACE);
  pgVar1 = parser->lexer->p[parser->lexer->n - 1];
  gVar3 = gravity_lexer_peek(pgVar1);
  if (gVar3 == TOK_OP_SEMICOLON) {
    gravity_lexer_next(pgVar1);
  }
  local_8d0 = gravity_class_null;
  if ((ast == (gravity_class_t *)0x0) || (((gnode_t *)((long)ast + 0x48))->tag != NODE_LIST_STAT)) {
    local_8a0 = (char *)0x0;
  }
  else {
    local_8a0 = (char *)local_838;
    snprintf(local_8a0,0x400,"%.*s",(ulong)((gnode_t *)((long)ast + 0x48))->refcount,
             *(undefined8 *)&((gnode_t *)((long)ast + 0x48))->block_length);
  }
  uVar15 = 0;
  if ((ast_00 == (gnode_t *)0x0) || (ast_00[1].tag != NODE_LIST_STAT)) {
    local_8a8 = (uint32_t *)0x0;
  }
  else {
    local_8a8 = &local_438;
    snprintf((char *)local_8a8,0x400,"%.*s",(ulong)ast_00[1].refcount,
             *(undefined8 *)&ast_00[1].block_length);
  }
  if ((ast_01 != (gnode_t *)0x0) && (iVar5 = string_cmp(*(char **)(ast_01 + 1),"NONE"), iVar5 != 0))
  {
    iVar5 = string_cmp(*(char **)(ast_01 + 1),"SYNTAX");
    if (iVar5 == 0) {
      uVar15 = 1;
    }
    else {
      iVar5 = string_cmp(*(char **)(ast_01 + 1),"SEMANTIC");
      if (iVar5 == 0) {
        uVar15 = 2;
      }
      else {
        iVar5 = string_cmp(*(char **)(ast_01 + 1),"RUNTIME");
        if (iVar5 == 0) {
          uVar15 = 3;
        }
        else {
          iVar5 = string_cmp(*(char **)(ast_01 + 1),"WARNING");
          uVar15 = (ulong)((uint)(iVar5 == 0) * 5);
        }
      }
    }
  }
  uVar16 = 0xffffffff;
  uVar4 = 0xffffffff;
  if ((local_8b0 != (gnode_t *)0x0) && (local_8b0[1].tag == NODE_LABEL_STAT)) {
    uVar4 = local_8b0[1].block_length;
  }
  if ((local_8b8 != (gnode_t *)0x0) && (local_8b8[1].tag == NODE_LABEL_STAT)) {
    uVar16 = local_8b8[1].block_length;
  }
  local_890 = uVar15;
  if (local_8c8 == (gnode_t *)0x0) {
switchD_0011c1e9_default:
    v.field_1.n = 0;
    v.isa = local_8d0;
    goto LAB_0011c243;
  }
  switch(local_8c8[1].tag) {
  case NODE_LIST_STAT:
    v = gravity_string_to_value((gravity_vm *)0x0,*(char **)&local_8c8[1].block_length,0xffffffff);
    goto LAB_0011c243;
  case NODE_COMPOUND_STAT:
    ppgVar9 = &gravity_class_float;
    break;
  case NODE_LABEL_STAT:
    ppgVar9 = &gravity_class_int;
    break;
  case NODE_FLOW_STAT:
    v.field_1.n._0_1_ = *(long *)&local_8c8[1].block_length != 0;
    v.isa = gravity_class_bool;
    v.field_1.n._1_7_ = 0;
    goto LAB_0011c243;
  default:
    goto switchD_0011c1e9_default;
  }
  v.field_1.n = *(anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)&local_8c8[1].block_length;
  v.isa = *ppgVar9;
LAB_0011c243:
  local_8d0 = v.isa;
  pgVar2 = parser->delegate;
  if ((pgVar2 == (gravity_delegate_t *)0x0) ||
     (pgVar2->unittest_callback == (gravity_unittest_callback)0x0)) {
    gravity_value_free((gravity_vm *)0x0,v);
    pgVar10 = extraout_RAX_02;
  }
  else {
    pgVar10 = (gnode_t *)
              (*pgVar2->unittest_callback)
                        ((gravity_vm *)0x0,(error_type_t)local_890,local_8a0,(char *)local_8a8,v,
                         uVar4,uVar16,pgVar2->xdata);
  }
  if (ast != (gravity_class_t *)0x0) {
    gnode_free((gnode_t *)ast);
    pgVar10 = extraout_RAX_03;
  }
  if (ast_00 != (gnode_t *)0x0) {
    gnode_free(ast_00);
    pgVar10 = extraout_RAX_04;
  }
  if (ast_01 != (gnode_t *)0x0) {
    gnode_free(ast_01);
    pgVar10 = extraout_RAX_05;
  }
  if (local_8b0 != (gnode_t *)0x0) {
    gnode_free(local_8b0);
    pgVar10 = extraout_RAX_06;
  }
  if (local_8b8 != (gnode_t *)0x0) {
    gnode_free(local_8b8);
    pgVar10 = extraout_RAX_07;
  }
  if (local_8c8 != (gnode_t *)0x0) {
    gnode_free(local_8c8);
    pgVar10 = extraout_RAX_08;
  }
  return pgVar10;
}

Assistant:

static gnode_t *parse_macro_statement (gravity_parser_t *parser) {
    typedef enum {
        MACRO_UNKNOWN = 0,
        MACRO_UNITEST = 1,
        MACRO_INCLUDE = 2,
        MACRO_PUSH = 3,
        MACRO_POP = 4
    } builtin_macro;

    DEBUG_PARSER("parse_macro_statement");
    DECLARE_LEXER;

    // consume special # symbol
    gtoken_t type = gravity_lexer_next(lexer);
    assert(type == TOK_MACRO);

    // check for #! and interpret #! shebang bash as one line comment
    // only if found on first line
    if (gravity_lexer_peek(lexer) == TOK_OP_NOT && gravity_lexer_lineno(lexer) == 1) {
        // consume special ! symbol
        type = gravity_lexer_next(lexer);
        assert(type == TOK_OP_NOT);

        // skip until EOL
        gravity_lexer_skip_line(lexer);
        return NULL;
    }

    // macro has its own parser because I don't want to mess standard syntax
    const char *macroid = parse_identifier(parser);
    if (macroid == NULL) goto handle_error;

    // check macro
    builtin_macro macro_type = MACRO_UNKNOWN;
    if (string_cmp(macroid, "unittest") == 0) macro_type = MACRO_UNITEST;
    else if (string_cmp(macroid, "include") == 0) macro_type = MACRO_INCLUDE;
    else if (string_cmp(macroid, "push") == 0) macro_type = MACRO_PUSH;
    else if (string_cmp(macroid, "pop") == 0) macro_type = MACRO_POP;
    mem_free(macroid);

    gtoken_s token = gravity_lexer_token(lexer);
    token.type = TOK_MACRO;
    PARSER_CALL_CALLBACK(token);

    switch (macro_type) {
        case MACRO_UNITEST:
            return parse_unittest_macro(parser);
            break;

        case MACRO_INCLUDE:
            return parse_include_macro(parser);
            break;

        case MACRO_PUSH:
            break;

        case MACRO_POP:
            break;

        case MACRO_UNKNOWN:
            break;
    }

handle_error:
    REPORT_WARNING(gravity_lexer_token(lexer), "%s", "Unknown macro token. Declaration will be ignored.");
    return NULL;
}